

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TensorValue_RepeatedStrings * __thiscall
google::protobuf::Arena::
DoCreateMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>(Arena *this)

{
  TensorValue_RepeatedStrings *this_00;
  
  this_00 = (TensorValue_RepeatedStrings *)
            AllocateAlignedWithHook
                      (this,0x30,
                       (type_info *)
                       &CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::typeinfo);
  CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::TensorValue_RepeatedStrings
            (this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }